

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O3

void __thiscall QTabBarPrivate::layoutTabs(QTabBarPrivate *this)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  QWidget *this_00;
  QWidgetData *pQVar4;
  Tab *pTVar5;
  QWidget *widget;
  int iVar6;
  int iVar7;
  int iVar8;
  LayoutDirection LVar9;
  QStyle *pQVar10;
  pointer pQVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  pointer pQVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  ArrowType type;
  ArrowType type_00;
  int iVar19;
  int iVar20;
  ulong uVar21;
  int iVar22;
  long in_FS_OFFSET;
  QRect QVar23;
  QRect QVar24;
  QRect QVar25;
  QStyleOption opt;
  Representation local_100;
  Representation local_e0;
  QRect local_b8;
  QRect local_a8;
  QList<QLayoutStruct> local_98;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QPalettePrivate *pQStack_50;
  undefined1 *local_48;
  QObject *pQStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  this->field_0x2d0 = this->field_0x2d0 & 0xfe;
  pQVar4 = this_00->data;
  iVar20 = (pQVar4->crect).x2.m_i;
  iVar16 = (pQVar4->crect).y2.m_i;
  iVar8 = (pQVar4->crect).x1.m_i;
  iVar19 = (pQVar4->crect).y1.m_i;
  uVar18 = this->shape - RoundedWest;
  pQVar10 = QWidget::style(this_00);
  iVar22 = 0;
  iVar7 = (**(code **)(*(long *)pQVar10 + 0xf0))(pQVar10,5,0,this_00,0);
  local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d.ptr = (QLayoutStruct *)&DAT_aaaaaaaaaaaaaaaa;
  QList<QLayoutStruct>::QList(&local_98,(this->tabList).d.size + 2);
  pQVar11 = QList<QLayoutStruct>::data(&local_98);
  pQVar11->stretch = 0;
  pQVar11->sizeHint = 0;
  pQVar11->maximumSize = 0x7ffff;
  pQVar11->minimumSize = 0;
  pQVar11->expansive = false;
  pQVar11->empty = true;
  pQVar11->spacing = 0;
  uVar1 = *(ushort *)&this->field_0x2d0;
  pQVar11 = QList<QLayoutStruct>::data(&local_98);
  pQVar11->expansive = (iVar7 != 8 && iVar7 != 1) && (uVar1 & 0x20) == 0;
  pQVar11 = QList<QLayoutStruct>::data(&local_98);
  pQVar11->empty = true;
  uVar15 = (this->tabList).d.size;
  if ((uVar18 & 0xfffffffa) == 0) {
    iVar20 = (iVar16 - iVar19) + 1;
    if (uVar15 == 0) {
      iVar19 = 1;
      iVar16 = 0;
    }
    else {
      iVar19 = 1;
      uVar21 = 0;
      iVar8 = 0;
      iVar22 = 0;
      iVar16 = 0;
      do {
        pTVar5 = (this->tabList).d.ptr[uVar21];
        if ((pTVar5->field_0xe4 & 2) != 0) {
          uVar12 = (**(code **)(*(long *)this_00 + 0x1a0))(this_00,uVar21 & 0xffffffff);
          iVar2 = (int)uVar12;
          iVar17 = (int)((ulong)uVar12 >> 0x20);
          (pTVar5->maxRect).x1.m_i = 0;
          (pTVar5->maxRect).y1.m_i = iVar8;
          (pTVar5->maxRect).x2.m_i = iVar2 + -1;
          (pTVar5->maxRect).y2.m_i = iVar17 + iVar8 + -1;
          if (iVar16 <= iVar2) {
            iVar16 = iVar2;
          }
          uVar12 = (**(code **)(*(long *)this_00 + 0x1a8))(this_00,uVar21 & 0xffffffff);
          iVar6 = (int)((ulong)uVar12 >> 0x20);
          (pTVar5->minRect).x1.m_i = 0;
          (pTVar5->minRect).y1.m_i = iVar22;
          (pTVar5->minRect).x2.m_i = (int)uVar12 + -1;
          (pTVar5->minRect).y2.m_i = iVar22 + -1 + iVar6;
          pQVar14 = QList<QLayoutStruct>::data(&local_98);
          pQVar11 = pQVar14 + iVar19;
          pQVar11->stretch = 0;
          pQVar11->sizeHint = 0;
          pQVar11->maximumSize = 0x7ffff;
          pQVar11->minimumSize = 0;
          pQVar14[iVar19].expansive = false;
          pQVar14[iVar19].empty = true;
          pQVar14[iVar19].spacing = 0;
          iVar2 = (pTVar5->maxRect).y2.m_i;
          iVar3 = (pTVar5->maxRect).y1.m_i;
          pQVar11 = QList<QLayoutStruct>::data(&local_98);
          pQVar11[iVar19].sizeHint = (iVar2 - iVar3) + 1;
          pQVar11 = QList<QLayoutStruct>::data(&local_98);
          pQVar11[iVar19].minimumSize = iVar6;
          pQVar11 = QList<QLayoutStruct>::data(&local_98);
          pQVar11[iVar19].empty = false;
          pQVar11 = QList<QLayoutStruct>::data(&local_98);
          pQVar11[iVar19].expansive = true;
          if ((this->field_0x2d0 & 0x20) == 0) {
            pQVar11 = QList<QLayoutStruct>::data(&local_98);
            iVar2 = pQVar11[iVar19].sizeHint;
            pQVar11 = QList<QLayoutStruct>::data(&local_98);
            pQVar11[iVar19].maximumSize = iVar2;
          }
          iVar8 = iVar8 + iVar17;
          iVar22 = iVar22 + iVar6;
          iVar19 = iVar19 + 1;
          uVar15 = (this->tabList).d.size;
        }
        uVar21 = uVar21 + 1;
      } while (uVar21 < uVar15);
    }
  }
  else {
    iVar20 = (iVar20 - iVar8) + 1;
    iVar19 = 1;
    if (uVar15 == 0) {
      iVar16 = 0;
    }
    else {
      uVar21 = 0;
      iVar22 = 0;
      iVar8 = 0;
      iVar16 = 0;
      do {
        pTVar5 = (this->tabList).d.ptr[uVar21];
        if ((pTVar5->field_0xe4 & 2) != 0) {
          uVar12 = (**(code **)(*(long *)this_00 + 0x1a0))(this_00,uVar21 & 0xffffffff);
          iVar2 = (int)((ulong)uVar12 >> 0x20);
          (pTVar5->maxRect).x1.m_i = iVar8;
          (pTVar5->maxRect).y1.m_i = 0;
          (pTVar5->maxRect).x2.m_i = iVar8 + (int)uVar12 + -1;
          (pTVar5->maxRect).y2.m_i = iVar2 + -1;
          if (iVar16 <= iVar2) {
            iVar16 = iVar2;
          }
          uVar13 = (**(code **)(*(long *)this_00 + 0x1a8))(this_00);
          iVar3 = (int)uVar13;
          (pTVar5->minRect).x1.m_i = iVar22;
          (pTVar5->minRect).y1.m_i = 0;
          (pTVar5->minRect).x2.m_i = iVar22 + iVar3 + -1;
          (pTVar5->minRect).y2.m_i = (int)((ulong)uVar13 >> 0x20) + -1;
          pQVar14 = QList<QLayoutStruct>::data(&local_98);
          pQVar11 = pQVar14 + iVar19;
          pQVar11->stretch = 0;
          pQVar11->sizeHint = 0;
          pQVar11->maximumSize = 0x7ffff;
          pQVar11->minimumSize = 0;
          pQVar14[iVar19].expansive = false;
          pQVar14[iVar19].empty = true;
          pQVar14[iVar19].spacing = 0;
          iVar2 = (pTVar5->maxRect).x2.m_i;
          iVar17 = (pTVar5->maxRect).x1.m_i;
          pQVar11 = QList<QLayoutStruct>::data(&local_98);
          pQVar11[iVar19].sizeHint = (iVar2 - iVar17) + 1;
          pQVar11 = QList<QLayoutStruct>::data(&local_98);
          pQVar11[iVar19].minimumSize = iVar3;
          pQVar11 = QList<QLayoutStruct>::data(&local_98);
          pQVar11[iVar19].empty = false;
          pQVar11 = QList<QLayoutStruct>::data(&local_98);
          pQVar11[iVar19].expansive = true;
          if ((this->field_0x2d0 & 0x20) == 0) {
            pQVar11 = QList<QLayoutStruct>::data(&local_98);
            iVar2 = pQVar11[iVar19].sizeHint;
            pQVar11 = QList<QLayoutStruct>::data(&local_98);
            pQVar11[iVar19].maximumSize = iVar2;
          }
          iVar8 = iVar8 + (int)uVar12;
          iVar22 = iVar22 + iVar3;
          iVar19 = iVar19 + 1;
          uVar15 = (this->tabList).d.size;
        }
        uVar21 = uVar21 + 1;
      } while (uVar21 < uVar15);
    }
  }
  pQVar14 = QList<QLayoutStruct>::data(&local_98);
  pQVar11 = pQVar14 + iVar19;
  pQVar11->stretch = 0;
  pQVar11->sizeHint = 0;
  pQVar11->maximumSize = 0x7ffff;
  pQVar11->minimumSize = 0;
  pQVar14[iVar19].expansive = false;
  pQVar14[iVar19].empty = true;
  pQVar14[iVar19].spacing = 0;
  uVar1 = *(ushort *)&this->field_0x2d0;
  pQVar11 = QList<QLayoutStruct>::data(&local_98);
  pQVar11[iVar19].expansive = (iVar7 != 2 && iVar7 != 8) && (uVar1 & 0x20) == 0;
  pQVar11 = QList<QLayoutStruct>::data(&local_98);
  pQVar11[iVar19].empty = true;
  iVar8 = iVar22;
  if (iVar22 < iVar20) {
    iVar8 = iVar20;
  }
  iVar19 = 0;
  qGeomCalc(&local_98,0,(int)local_98.d.size,0,iVar8,0);
  if ((this->tabList).d.size != 0) {
    uVar15 = 0;
    do {
      pTVar5 = (this->tabList).d.ptr[uVar15];
      if ((pTVar5->field_0xe4 & 2) == 0) {
        (pTVar5->rect).x1 = 0;
        (pTVar5->rect).y1 = 0;
        (pTVar5->rect).x2 = -1;
        (pTVar5->rect).y2 = -1;
        iVar19 = iVar19 + 1;
      }
      else {
        iVar7 = ((int)uVar15 + 1) - iVar19;
        iVar8 = local_98.d.ptr[iVar7].pos;
        iVar7 = local_98.d.ptr[iVar7].size;
        if ((uVar18 & 0xfffffffa) == 0) {
          (pTVar5->rect).x1.m_i = 0;
          (pTVar5->rect).y1.m_i = iVar8;
          (pTVar5->rect).x2.m_i = iVar16 + -1;
          (pTVar5->rect).y2.m_i = iVar8 + iVar7 + -1;
        }
        else {
          (pTVar5->rect).x1.m_i = iVar8;
          (pTVar5->rect).y1.m_i = 0;
          (pTVar5->rect).x2.m_i = iVar8 + iVar7 + -1;
          (pTVar5->rect).y2.m_i = iVar16 + -1;
        }
      }
      uVar15 = uVar15 + 1;
      uVar21 = (this->tabList).d.size;
    } while (uVar15 < uVar21);
    if (((iVar20 < iVar22) && (uVar21 != 0)) && ((*(ushort *)&this->field_0x2d0 & 8) != 0)) {
      QVar23 = normalizedScrollRect(this,0);
      widget = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_40 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_50 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOption::QStyleOption((QStyleOption *)&local_78,1,0);
      QStyleOption::initFrom((QStyleOption *)&local_78,widget);
      pQVar10 = QWidget::style(widget);
      QVar24 = (QRect)(**(code **)(*(long *)pQVar10 + 0xc0))
                                (pQVar10,0x35,(QStyleOption *)&local_78,widget);
      local_a8 = QVar24;
      pQVar10 = QWidget::style(widget);
      QVar25 = (QRect)(**(code **)(*(long *)pQVar10 + 0xc0))
                                (pQVar10,0x36,(QStyleOption *)&local_78,widget);
      local_b8 = QVar25;
      pQVar10 = QWidget::style(widget);
      iVar20 = (**(code **)(*(long *)pQVar10 + 0xe0))(pQVar10,0x33,(QStyleOption *)&local_78,widget)
      ;
      if ((uVar18 & 0xfffffffa) == 0) {
        local_a8.y2.m_i = iVar20 + QVar24.y1.m_i.m_i + -1;
        local_b8.y1.m_i = (QVar25.y2.m_i.m_i - iVar20) + 1;
        type = DownArrow;
        type_00 = UpArrow;
      }
      else {
        LVar9 = QWidget::layoutDirection(widget);
        if (LVar9 == RightToLeft) {
          local_100 = QVar25.x1.m_i;
          local_b8.x2.m_i = iVar20 + -1 + local_100.m_i;
          local_a8.x1.m_i = (QVar24.x2.m_i.m_i - iVar20) + 1;
          type = LeftArrow;
          type_00 = RightArrow;
        }
        else {
          local_a8.x2.m_i = iVar20 + -1 + QVar24.x1.m_i.m_i;
          local_b8.x1.m_i = (QVar25.x2.m_i.m_i - iVar20) + 1;
          type = RightArrow;
          type_00 = LeftArrow;
        }
      }
      QToolButton::setArrowType(this->leftB,type_00);
      QToolButton::setArrowType(this->rightB,type);
      QWidget::setGeometry((QWidget *)this->leftB,&local_a8);
      QWidget::setEnabled((QWidget *)this->leftB,false);
      QWidget::show((QWidget *)this->leftB);
      QWidget::setGeometry((QWidget *)this->rightB,&local_b8);
      local_e0 = QVar23.x1.m_i;
      QWidget::setEnabled((QWidget *)this->rightB,QVar23.x2.m_i.m_i + 1 < iVar22 + local_e0.m_i);
      QWidget::show((QWidget *)this->rightB);
      QStyleOption::~QStyleOption((QStyleOption *)&local_78);
      goto LAB_00489fbe;
    }
  }
  QWidget::hide((QWidget *)this->rightB);
  QWidget::hide((QWidget *)this->leftB);
LAB_00489fbe:
  layoutWidgets(this,0);
  (**(code **)(*(long *)this_00 + 0x1c0))();
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,0x20,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTabBarPrivate::layoutTabs()
{
    Q_Q(QTabBar);
    layoutDirty = false;
    QSize size = q->size();
    int last, available;
    int maxExtent;
    bool vertTabs = verticalTabs(shape);
    int tabChainIndex = 0;
    int hiddenTabs = 0;

    Qt::Alignment tabAlignment = Qt::Alignment(q->style()->styleHint(QStyle::SH_TabBar_Alignment, nullptr, q));
    QList<QLayoutStruct> tabChain(tabList.size() + 2);

    // We put an empty item at the front and back and set its expansive attribute
    // depending on tabAlignment and expanding.
    tabChain[tabChainIndex].init();
    tabChain[tabChainIndex].expansive = (!expanding)
                                        && (tabAlignment != Qt::AlignLeft)
                                        && (tabAlignment != Qt::AlignJustify);
    tabChain[tabChainIndex].empty = true;
    ++tabChainIndex;

    // We now go through our list of tabs and set the minimum size and the size hint
    // This will allow us to elide text if necessary. Since we don't set
    // a maximum size, tabs will EXPAND to fill up the empty space.
    // Since tab widget is rather *ahem* strict about keeping the geometry of the
    // tab bar to its absolute minimum, this won't bleed through, but will show up
    // if you use tab bar on its own (a.k.a. not a bug, but a feature).
    // Update: if expanding is false, we DO set a maximum size to prevent the tabs
    // being wider than necessary.
    if (!vertTabs) {
        int minx = 0;
        int x = 0;
        int maxHeight = 0;
        for (int i = 0; i < tabList.size(); ++i) {
            const auto tab = tabList.at(i);
            if (!tab->visible) {
                ++hiddenTabs;
                continue;
            }
            QSize sz = q->tabSizeHint(i);
            tab->maxRect = QRect(x, 0, sz.width(), sz.height());
            x += sz.width();
            maxHeight = qMax(maxHeight, sz.height());
            sz = q->minimumTabSizeHint(i);
            tab->minRect = QRect(minx, 0, sz.width(), sz.height());
            minx += sz.width();
            tabChain[tabChainIndex].init();
            tabChain[tabChainIndex].sizeHint = tab->maxRect.width();
            tabChain[tabChainIndex].minimumSize = sz.width();
            tabChain[tabChainIndex].empty = false;
            tabChain[tabChainIndex].expansive = true;

            if (!expanding)
                tabChain[tabChainIndex].maximumSize = tabChain[tabChainIndex].sizeHint;
            ++tabChainIndex;
        }

        last = minx;
        available = size.width();
        maxExtent = maxHeight;
    } else {
        int miny = 0;
        int y = 0;
        int maxWidth = 0;
        for (int i = 0; i < tabList.size(); ++i) {
            auto tab = tabList.at(i);
            if (!tab->visible) {
                ++hiddenTabs;
                continue;
            }
            QSize sz = q->tabSizeHint(i);
            tab->maxRect = QRect(0, y, sz.width(), sz.height());
            y += sz.height();
            maxWidth = qMax(maxWidth, sz.width());
            sz = q->minimumTabSizeHint(i);
            tab->minRect = QRect(0, miny, sz.width(), sz.height());
            miny += sz.height();
            tabChain[tabChainIndex].init();
            tabChain[tabChainIndex].sizeHint = tab->maxRect.height();
            tabChain[tabChainIndex].minimumSize = sz.height();
            tabChain[tabChainIndex].empty = false;
            tabChain[tabChainIndex].expansive = true;

            if (!expanding)
                tabChain[tabChainIndex].maximumSize = tabChain[tabChainIndex].sizeHint;
            ++tabChainIndex;
        }

        last = miny;
        available = size.height();
        maxExtent = maxWidth;
    }

    // Mirror our front item.
    tabChain[tabChainIndex].init();
    tabChain[tabChainIndex].expansive = (!expanding)
                                        && (tabAlignment != Qt::AlignRight)
                                        && (tabAlignment != Qt::AlignJustify);
    tabChain[tabChainIndex].empty = true;
    Q_ASSERT(tabChainIndex == tabChain.size() - 1 - hiddenTabs); // add an assert just to make sure.

    // Do the calculation
    qGeomCalc(tabChain, 0, tabChain.size(), 0, qMax(available, last), 0);

    // Use the results
    hiddenTabs = 0;
    for (int i = 0; i < tabList.size(); ++i) {
        auto tab = tabList.at(i);
        if (!tab->visible) {
            tab->rect = QRect();
            ++hiddenTabs;
            continue;
        }
        const QLayoutStruct &lstruct = tabChain.at(i + 1 - hiddenTabs);
        if (!vertTabs)
            tab->rect.setRect(lstruct.pos, 0, lstruct.size, maxExtent);
        else
            tab->rect.setRect(0, lstruct.pos, maxExtent, lstruct.size);
    }

    if (useScrollButtons && tabList.size() && last > available) {
        const QRect scrollRect = normalizedScrollRect(0);

        Q_Q(QTabBar);
        QStyleOption opt;
        opt.initFrom(q);
        QRect scrollButtonLeftRect = q->style()->subElementRect(QStyle::SE_TabBarScrollLeftButton, &opt, q);
        QRect scrollButtonRightRect = q->style()->subElementRect(QStyle::SE_TabBarScrollRightButton, &opt, q);
        int scrollButtonWidth = q->style()->pixelMetric(QStyle::PM_TabBarScrollButtonWidth, &opt, q);

        // Normally SE_TabBarScrollLeftButton should have the same width as PM_TabBarScrollButtonWidth.
        // But if that is not the case, we set the actual button width to PM_TabBarScrollButtonWidth, and
        // use the extra space from SE_TabBarScrollLeftButton as margins towards the tabs.
        if (vertTabs) {
            scrollButtonLeftRect.setHeight(scrollButtonWidth);
            scrollButtonRightRect.setY(scrollButtonRightRect.bottom() + 1 - scrollButtonWidth);
            scrollButtonRightRect.setHeight(scrollButtonWidth);
            leftB->setArrowType(Qt::UpArrow);
            rightB->setArrowType(Qt::DownArrow);
        } else if (q->layoutDirection() == Qt::RightToLeft) {
            scrollButtonRightRect.setWidth(scrollButtonWidth);
            scrollButtonLeftRect.setX(scrollButtonLeftRect.right() + 1 - scrollButtonWidth);
            scrollButtonLeftRect.setWidth(scrollButtonWidth);
            leftB->setArrowType(Qt::RightArrow);
            rightB->setArrowType(Qt::LeftArrow);
        } else {
            scrollButtonLeftRect.setWidth(scrollButtonWidth);
            scrollButtonRightRect.setX(scrollButtonRightRect.right() + 1 - scrollButtonWidth);
            scrollButtonRightRect.setWidth(scrollButtonWidth);
            leftB->setArrowType(Qt::LeftArrow);
            rightB->setArrowType(Qt::RightArrow);
        }

        leftB->setGeometry(scrollButtonLeftRect);
        leftB->setEnabled(false);
        leftB->show();

        rightB->setGeometry(scrollButtonRightRect);
        rightB->setEnabled(last + scrollRect.left() > scrollRect.x() + scrollRect.width());
        rightB->show();
    } else {
        rightB->hide();
        leftB->hide();
    }

    layoutWidgets();
    q->tabLayoutChange();
}